

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O2

Score Search::search<(Nodetype)0>(position *pos,int16 alpha,int16 beta,U16 depth,node *stack)

{
  int *piVar1;
  Searchthread *t;
  pointer pRVar2;
  pointer pcVar3;
  Score SVar4;
  U8 UVar5;
  U8 UVar6;
  node *pnVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  U16 depth_00;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ostream *poVar17;
  ulong extraout_RAX;
  undefined7 extraout_var;
  uint uVar18;
  undefined6 in_register_0000000a;
  ushort uVar19;
  undefined8 extraout_RDX;
  Move *m;
  undefined8 extraout_RDX_00;
  undefined8 uVar20;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined7 uVar21;
  node *pnVar22;
  short sVar23;
  Score SVar24;
  value_type *__x;
  byte bVar25;
  short sVar26;
  Score SVar27;
  bool bVar28;
  float __x_00;
  Move move;
  Move local_266;
  Move local_263;
  int local_260;
  uint local_25c;
  undefined8 local_258;
  node *local_250;
  Score local_244;
  char local_23f;
  byte local_23e;
  bool pvNode;
  Score local_23c;
  int local_238;
  undefined4 local_234;
  Score local_230;
  Score local_22c;
  Move local_226;
  Move local_223;
  int local_220;
  Score bestScore;
  value_type *local_218;
  ulong local_210;
  undefined4 local_208;
  uint local_204;
  Score ttvalue;
  U8 local_1fb;
  U8 local_1fa;
  U8 local_1f9;
  node *local_1f8;
  int local_1f0;
  undefined4 local_1ec;
  ulong local_1e8;
  Score local_1dc;
  Score local_1d8;
  uint local_1d4;
  Score local_1d0;
  int16 local_1ca;
  Move *local_1c8;
  ulong local_1c0;
  vector<Move,_std::allocator<Move>_> quiets;
  string local_1a0;
  Move *local_180;
  long local_178;
  Moveorder mvs;
  Move pv [68];
  
  if (UCI_SIGNALS.stop) {
    return draw;
  }
  local_250 = stack;
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DoubleEspresso[P]chess/src/search.hpp"
                  ,0x139,"Score Search::search(position &, int16, int16, U16, node *) [type = root]"
                 );
  }
  local_25c = (uint)CONCAT62(in_register_0000000a,depth);
  SVar24 = (Score)alpha;
  local_263.f = '\0';
  local_263.t = '\0';
  bestScore = ninf;
  local_263.type = '\x11';
  local_266.f = '\0';
  local_266.t = '\0';
  local_266.type = '\x11';
  lVar15 = 2;
  do {
    *(undefined2 *)((long)pv + lVar15 + -2) = 0;
    (&pv[0].f)[lVar15] = '\x11';
    lVar15 = lVar15 + 3;
  } while (lVar15 != 0xce);
  ttvalue = ninf;
  bVar8 = position::in_check(pos);
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_250->in_check = bVar8;
  local_260 = *(int *)(local_250 + -1);
  local_250->ply = (U16)(local_260 + 1U);
  uVar18 = local_260 + 1U & 0xffff;
  pvNode = (short)local_260 == 0;
  if (pvNode) {
    if ((selDepth <= (int)uVar18) && (pos->thread_id == 0)) {
      selDepth = selDepth + 1;
    }
  }
  else if (!bVar8) {
    bVar9 = position::is_draw(pos);
    SVar27 = draw;
    if (bVar9) goto LAB_00124485;
  }
  SVar27 = mate - uVar18;
  SVar4 = (int)beta;
  if (SVar27 < beta) {
    SVar4 = SVar27;
  }
  if (SVar27 <= SVar24) goto LAB_00124485;
  SVar27 = uVar18 + mated;
  local_22c = SVar24;
  if (SVar24 < SVar27) {
    local_22c = SVar27;
  }
  sVar23 = (short)SVar4;
  if (sVar23 <= SVar27) goto LAB_00124485;
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
       '\0';
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
       '\0';
  mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_1_ =
       '\x11';
  local_1a0._M_dataplus._M_p = (pointer)(pos->ifo).key;
  local_244 = (int)sVar23;
  local_1d0 = SVar27;
  bVar9 = hash_table::fetch(&ttable,(U64 *)&local_1a0,(hash_data *)&mvs);
  SVar24 = ninf;
  local_210 = (ulong)(ushort)local_25c;
  if (bVar9) {
    hashHits = hashHits + 1;
    local_266 = mvs.m_captures.super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._2_3_;
    SVar24 = (Score)mvs._vptr_Moveorder._4_2_;
    ttvalue = SVar24;
    if ((short)local_260 != 0) {
      local_210._0_4_ = local_25c & 0xffff;
      if ((int)(uint)local_210 <= (int)(char)mvs._vptr_Moveorder) {
        if (SVar24 < local_244) {
          if (mvs._vptr_Moveorder._1_1_ == '\x01') {
LAB_00123883:
            local_1a0._M_dataplus._M_p._0_2_ = (ushort)local_25c;
            position::stats_update
                      (pos,&local_266,&local_250[-1].curr_move,(int16 *)&local_1a0,&ttvalue,&quiets,
                       local_250->killers);
            SVar27 = ttvalue;
            goto LAB_00124485;
          }
        }
        else if (mvs._vptr_Moveorder._1_1_ == '\0') goto LAB_00123883;
      }
    }
  }
  bVar9 = position::pawns_near_promotion(pos);
  position::pawns_on_7th(pos);
  if (SVar24 == ninf) {
    SVar24 = local_250[-2].static_eval;
    if ((SVar24 != ninf && !bVar8) && (local_250[-1].static_eval <= SVar24)) {
      SVar24 = SVar24 + 0xf;
      goto LAB_0012398b;
    }
    if (!bVar8) {
      t = SearchThreads.workers.super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>.
          _M_impl.super__Vector_impl_data._M_start[pos->thread_id];
      mvs._vptr_Moveorder._0_4_ = lazy_eval_margin_search((int)local_210,bVar9);
      __x_00 = eval::evaluate(pos,t,(float *)&mvs);
      lVar15 = lroundf(__x_00);
      SVar24 = (Score)lVar15;
      local_250->static_eval = SVar24;
      goto LAB_00123999;
    }
    local_250->static_eval = ninf;
    SVar24 = ninf;
LAB_001239b6:
    bVar28 = false;
  }
  else {
LAB_0012398b:
    local_250->static_eval = SVar24;
    if (bVar8) goto LAB_001239b6;
LAB_00123999:
    if ((((short)local_260 == 0) || (local_250[-1].curr_move.type != '\n')) ||
       (local_250->null_search != false)) goto LAB_001239b6;
    bVar28 = (((short)(undefined2)local_22c - local_244) + 1U & 0xfffffffdU) == 0 && SVar24 != ninf;
  }
  if ((pos->ifo).stm == white) {
    bVar10 = position::non_pawn_material<(Color)0>(pos);
  }
  else {
    bVar10 = position::non_pawn_material<(Color)1>(pos);
  }
  pnVar7 = local_250;
  if (((bVar28 & bVar10 & 5 < (ushort)local_25c) == 1) &&
     (local_244 <= SVar24 + (int)local_210 * 8 + 0xfffffe00)) {
    local_250[1].null_search = true;
    position::do_null_move(pos);
    depth_00 = (short)local_25c - (short)(local_210 >> 1);
    if ((short)depth_00 < 2) {
      SVar24 = qsearch<(Nodetype)2>(pos,-sVar23,1 - sVar23,0,pnVar7 + 1);
    }
    else {
      SVar24 = search<(Nodetype)2>(pos,-sVar23,1 - sVar23,depth_00,pnVar7 + 1);
    }
    position::undo_null_move(pos);
    SVar27 = -SVar24;
    local_250[1].null_search = false;
    if (local_244 == SVar27 || SBORROW4(local_244,SVar27) != local_244 + SVar24 < 0) {
LAB_00124485:
      std::_Vector_base<Move,_std::allocator<Move>_>::~_Vector_base
                (&quiets.super__Vector_base<Move,_std::allocator<Move>_>);
      return SVar27;
    }
    if ((local_250[1].best_move.type == '\v') && (499 < SVar24 + local_244)) {
      UVar5 = local_250[1].best_move.t;
      (local_250->threat_move).f = local_250[1].best_move.f;
      (local_250->threat_move).t = UVar5;
      (local_250->threat_move).type = '\v';
    }
  }
  pnVar7 = local_250;
  haVoc::Moveorder::Moveorder(&mvs,pos,&local_266,local_250);
  move.f = '\0';
  move.t = '\0';
  move.type = '\x11';
  local_223.f = pnVar7[-1].curr_move.f;
  local_223.t = pnVar7[-1].curr_move.t;
  local_223.type = pnVar7[-1].curr_move.type;
  local_226.f = pnVar7[-2].curr_move.f;
  local_226.t = pnVar7[-2].curr_move.t;
  local_226.type = pnVar7[-2].curr_move.type;
  local_1d8 = pnVar7[-2].static_eval;
  local_1dc = pnVar7->static_eval;
  local_1c0 = (ulong)(pos->ifo).stm;
  if ((short)local_260 == 0) {
    pRVar2 = (pos->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = ((long)*(pointer *)
                     ((long)&(pRVar2->pv).super__Vector_base<Move,_std::allocator<Move>_>._M_impl +
                     8) -
             *(long *)&(pRVar2->pv).super__Vector_base<Move,_std::allocator<Move>_>._M_impl) / 3;
    local_1ec = (undefined4)CONCAT71((int7)(uVar16 >> 8),4 < uVar16);
  }
  else {
    local_1ec = 0;
  }
  uVar18 = (uint)(pos->ifo).key & 0x3ff;
  if (searching_positions[uVar18].searching == false) {
    uVar19 = pos->thread_id;
    searching_positions[uVar18].searching = true;
    searching_positions[uVar18].id = (uint)uVar19;
  }
  local_180 = &pnVar7[-1].curr_move;
  uVar14 = (uint)local_210;
  local_1d4 = uVar14 * uVar14 + 6 >> (local_1dc < local_1d8);
  local_1c8 = pnVar7->killers;
  local_1f8 = pnVar7 + 1;
  uVar18 = 0x3f;
  if (uVar14 < 0x3f) {
    uVar18 = uVar14;
  }
  sVar23 = -sVar23;
  SVar24 = ninf;
  bVar28 = false;
  local_178 = (long)&bitboards::reductions +
              (ulong)(uVar18 << 8) + (ulong)(local_1d8 <= local_1dc) * 0x4000 +
              (ulong)((short)local_260 == 0) * 0x8000;
  local_238 = 0;
  pnVar22 = pnVar7;
  do {
    local_23c = (Score)(short)local_22c;
    local_1f0 = -local_22c;
    local_22c = ~local_22c;
    local_230 = SVar24;
    do {
      local_23e = local_230 < local_23c && (ushort)local_25c < 2;
      local_23f = mated_max_ply < local_230 && local_230 < local_23c;
      do {
        local_218 = (value_type *)(CONCAT71(local_218._1_7_,1 < (ushort)local_238 & local_23e) ^ 1);
        do {
          do {
            bVar10 = haVoc::Moveorder::next_move
                               (&mvs,pos,&move,&local_223,&local_226,&pnVar7->threat_move,bVar28,
                                local_1ec._0_1_);
            if (!bVar10) goto LAB_0012437e;
            if (UCI_SIGNALS.stop != false) goto LAB_00124255;
          } while ((move.type == '\x11') || (bVar10 = position::is_legal(pos,&move), !bVar10));
          uVar16 = (ulong)(ushort)local_238;
          uVar20 = extraout_RDX;
          local_1e8 = uVar16;
          if ((pos->thread_id == 0 && (short)local_260 == 0) && (3000.0 < elapsed)) {
            poVar17 = std::operator<<((ostream *)&std::cout,"info depth ");
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,(ushort)local_210);
            local_258 = (Rootmove *)std::operator<<(poVar17," currmove ");
            uci::move_to_string_abi_cxx11_(&local_1a0,(uci *)&move,m);
            poVar17 = std::operator<<((ostream *)local_258,(string *)&local_1a0);
            poVar17 = std::operator<<(poVar17," currmovenumber ");
            poVar17 = (ostream *)std::ostream::operator<<(poVar17,(ushort)local_1e8);
            std::endl<char,std::char_traits<char>>(poVar17);
            std::__cxx11::string::~string((string *)&local_1a0);
            uVar16 = extraout_RAX;
            uVar20 = extraout_RDX_00;
          }
          if ((move.f == local_266.f) && (move.t == local_266.t)) {
            uVar20 = CONCAT71((int7)((ulong)uVar20 >> 8),1);
            local_258 = (Rootmove *)CONCAT44(local_258._4_4_,(int)uVar20);
            if (move.type != local_266.type) goto LAB_00123d0c;
          }
          else {
LAB_00123d0c:
            if ((move.f == local_1c8->f) && (move.t == pnVar22->killers[0].t)) {
              uVar20 = CONCAT71((int7)((ulong)uVar20 >> 8),1);
              local_258 = (Rootmove *)CONCAT44(local_258._4_4_,(int)uVar20);
              if (move.type == pnVar22->killers[0].type) goto LAB_00123d90;
            }
            if ((move.f == pnVar22->killers[1].f) && (move.t == pnVar22->killers[1].t)) {
              uVar20 = CONCAT71((int7)((ulong)uVar20 >> 8),1);
              local_258 = (Rootmove *)CONCAT44(local_258._4_4_,(int)uVar20);
              if (move.type == pnVar22->killers[1].type) goto LAB_00123d90;
            }
            if ((move.f == pnVar22->killers[2].f) && (move.t == pnVar22->killers[2].t)) {
              local_258 = (Rootmove *)
                          CONCAT44(local_258._4_4_,(int)CONCAT71((int7)((ulong)uVar20 >> 8),1));
              if (move.type == pnVar22->killers[2].type) goto LAB_00123d90;
            }
            if ((move.f == pnVar22->killers[3].f) && (move.t == pnVar22->killers[3].t)) {
              local_258 = (Rootmove *)
                          CONCAT44(local_258._4_4_,
                                   (int)CONCAT71((int7)(uVar16 >> 8),
                                                 move.type == pnVar22->killers[3].type));
            }
            else {
              local_258 = (Rootmove *)((ulong)local_258._4_4_ << 0x20);
            }
          }
LAB_00123d90:
          bVar10 = position::is_promotion(pos,&move.type);
          bVar11 = true;
          uVar20 = extraout_RDX_01;
          if (1 < (byte)(move.type - 0xb)) {
            local_1a0._M_dataplus._M_p._0_4_ = (uint)move.type;
            bVar11 = position::is_cap_promotion(pos,(Movetype *)&local_1a0);
            uVar20 = extraout_RDX_02;
          }
          if ((pos->pcs).piece_on._M_elems[move.t] == pawn) {
            uVar21 = (undefined7)((ulong)uVar20 >> 8);
            if (local_1c0 == 0) {
              local_234 = (undefined4)CONCAT71(uVar21,0x27 < move.t);
            }
            else {
              local_234 = (undefined4)CONCAT71(uVar21,move.t < 0x18);
            }
          }
          else {
            local_234 = 0;
          }
          if ((pnVar22->threat_move).type == '\x11') {
            local_204 = 0;
          }
          else {
            local_204 = (uint)(byte)((pnVar7->threat_move).f == move.t & bVar11);
          }
          local_220 = CONCAT31(local_220._1_3_,pnVar22[-1].curr_move.type);
          if (move.type == '\n') {
            bVar12 = position::quiet_gives_dangerous_check(pos,&move);
            local_208 = (undefined4)CONCAT71(extraout_var,bVar12);
          }
          else {
            local_208 = 0;
          }
        } while (((((!bVar8 && !bVar10) && (char)local_258 == '\0') &&
                   (bVar11 == true && (short)local_260 != 0)) && ((byte)local_218 == '\0')) &&
                (iVar13 = position::see(pos,&move), iVar13 < 0));
        local_218 = (value_type *)CONCAT71(local_218._1_7_,(char)local_220 == '\v');
        position::do_move(pos,&move);
        (pnVar22->curr_move).f = move.f;
        (pnVar22->curr_move).t = move.t;
        (pnVar22->curr_move).type = move.type;
        bVar12 = position::in_check(pos);
        bVar25 = (byte)local_258;
        if ((short)local_260 == 0) {
          uVar19 = 0xffff;
          uVar18 = (uint)bVar12;
        }
        else {
          uVar19 = (byte)((((bVar8 || bVar12) || bVar10) || local_23c < local_230) |
                         local_1d8 <= local_1dc | bVar11 |
                         bVar25 | (byte)local_234 | 2 < (ushort)local_25c) | 0xfffe;
          uVar18 = (uint)bVar12;
          if ((local_1dc < local_1d8) &&
             (uVar18 = (uint)bVar12, (bVar25 == 0 && bVar11 == false) && 2 >= (ushort)local_25c)) {
            uVar18 = bVar12 + 1;
            if ((((byte)local_234 | (byte)local_208 | (byte)local_204) & 1) == 0) {
              uVar18 = (uint)bVar12;
            }
            if (local_23f == '\0') {
              uVar18 = (uint)bVar12;
            }
          }
        }
        bVar28 = local_1d4 <= (uint)local_1e8;
        pnVar22[1].pv = (Move *)0x0;
        uVar18 = uVar18 + (int)(short)uVar19 + local_25c;
        sVar26 = (short)uVar18;
        if ((ushort)local_238 < 3) {
          pnVar22[1].pv = pv;
          pv[0].f = '\0';
          pv[0].t = '\0';
          pv[0].type = '\x11';
          if (sVar26 < 2) {
            SVar24 = qsearch<(Nodetype)1>(pos,sVar23,(int16)local_1f0,0,local_1f8);
          }
          else {
            SVar24 = search<(Nodetype)1>(pos,sVar23,(int16)local_1f0,sVar26 - 1,local_1f8);
          }
LAB_00124126:
          SVar24 = -SVar24;
        }
        else {
          uVar14 = uVar18;
          if (((((!bVar10 &&
                 (((byte)local_234 |
                  bVar25 | (byte)local_204 | (byte)local_208 | (ushort)local_25c < 3 | bVar9) & 1)
                 == 0) && !bVar8) && (bVar11 & (byte)local_218) == 0) && !bVar12) &&
             (local_230 <= local_23c)) {
            uVar16 = local_1e8;
            if (0x3e < (uint)local_1e8) {
              uVar16 = 0x3f;
            }
            uVar14 = (uint)(ushort)(sVar26 - *(short *)(local_178 + (uVar16 & 0xffffffff) * 4));
          }
          local_218 = (value_type *)CONCAT44(local_218._4_4_,uVar18);
          local_258 = (Rootmove *)CONCAT44(local_258._4_4_,(int)(int16)local_1f0);
          local_220 = (int)sVar23;
          if ((short)uVar14 < 2) {
            SVar24 = qsearch<(Nodetype)2>(pos,(undefined2)local_22c,(int16)local_1f0,0,local_1f8);
          }
          else {
            SVar24 = search<(Nodetype)2>(pos,(undefined2)local_22c,(int16)local_1f0,
                                         (short)uVar14 - 1,local_1f8);
          }
          SVar24 = -SVar24;
          if (local_23c < SVar24) {
            pnVar22[1].pv = pv;
            pv[0].f = '\0';
            pv[0].t = '\0';
            pv[0].type = '\x11';
            if ((short)local_218 < 2) {
              SVar24 = qsearch<(Nodetype)1>(pos,(int16)local_220,(int16)local_258,0,local_1f8);
            }
            else {
              SVar24 = search<(Nodetype)1>(pos,(int16)local_220,(int16)local_258,
                                           (short)local_218 - 1,local_1f8);
            }
            goto LAB_00124126;
          }
        }
        if (move.type == '\n') {
          std::vector<Move,std::allocator<Move>>::emplace_back<Move&>
                    ((vector<Move,std::allocator<Move>> *)&quiets,&move);
        }
        position::undo_move(pos,&move);
        if (UCI_SIGNALS.stop != false) {
LAB_00124255:
          SVar27 = draw;
          goto LAB_00124478;
        }
        if ((short)local_260 == 0) {
          local_258 = std::
                      __find_if<__gnu_cxx::__normal_iterator<Rootmove*,std::vector<Rootmove,std::allocator<Rootmove>>>,__gnu_cxx::__ops::_Iter_equals_val<Move_const>>
                                ((pos->root_moves).
                                 super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
                                 super__Vector_impl_data._M_start,
                                 (pos->root_moves).
                                 super__Vector_base<Rootmove,_std::allocator<Rootmove>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&move);
          if (((ushort)local_238 == 0) || (local_23c < SVar24)) {
            local_258->score = SVar24;
            local_258->selDepth = selDepth;
            std::vector<Move,_std::allocator<Move>_>::resize(&local_258->pv,1);
            __x = pnVar22[1].pv;
            while ((__x->f != __x->t && (__x->type != '\x11'))) {
              local_218 = __x;
              std::vector<Move,_std::allocator<Move>_>::push_back(&local_258->pv,__x);
              __x = local_218 + 1;
            }
          }
          else {
            local_258->score = ninf;
          }
        }
        local_238 = local_238 + 1;
      } while (SVar24 <= local_230);
      UVar5 = move.f;
      UVar6 = move.t;
      local_263.f = move.f;
      local_263.t = move.t;
      local_263.type = move.type;
      (pnVar22->best_move).f = UVar5;
      (pnVar22->best_move).t = UVar6;
      (pnVar22->best_move).type = move.type;
      bestScore = SVar24;
      if (local_244 <= SVar24) {
        local_1a0._M_dataplus._M_p._0_2_ = (short)local_25c;
        position::stats_update
                  (pos,&local_263,local_180,(int16 *)&local_1a0,&bestScore,&quiets,local_1c8);
        local_230 = bestScore;
        pnVar22 = local_250;
LAB_0012437e:
        pcVar3 = (pointer)(pos->ifo).key;
        uVar18 = (uint)pcVar3 & 0x3ff;
        searching_positions[uVar18].searching = false;
        searching_positions[uVar18].id = -1;
        if ((local_23c <= local_230) && (local_230 < local_244)) {
          if (local_263.f != local_263.t) {
            piVar1 = pnVar22->bestMoveHistory->bm[local_1c0][local_263.f] + local_263.t;
            *piVar1 = *piVar1 + (int)local_210 * 2;
          }
        }
        if ((ushort)local_238 == 0) {
          SVar27 = draw;
          if (bVar8) {
            SVar27 = local_1d0;
          }
        }
        else {
          local_1fa = (local_263.type != '\x11' && (short)local_260 == 0) + '\x01';
          if (local_244 <= local_230) {
            local_1fa = '\0';
          }
          local_1f9 = (U8)local_25c;
          local_1fb = (U8)pnVar22->ply;
          local_1ca = (int16)local_230;
          local_1a0._M_dataplus._M_p = pcVar3;
          hash_table::save(&ttable,(U64 *)&local_1a0,&local_1f9,&local_1fa,&local_1fb,&local_263,
                           &local_1ca,&pvNode);
          SVar27 = bestScore;
        }
LAB_00124478:
        haVoc::Moveorder::~Moveorder(&mvs);
        goto LAB_00124485;
      }
      pnVar22 = local_250;
      local_230 = SVar24;
    } while (SVar24 <= local_23c);
    local_22c = local_23c;
    if ((short)local_260 == 0) {
      local_22c = SVar24;
    }
  } while( true );
}

Assistant:

Score Search::search(position& pos, int16 alpha, int16 beta, U16 depth, node* stack) {

	if (UCI_SIGNALS.stop)
		return Score::draw;

	assert(alpha < beta);

	Score bestScore = Score::ninf;
	Move best_move = {};
	best_move.type = Movetype::no_type;
	size_t deferred = 0;

	Move ttm = {}; ttm.type = Movetype::no_type; // refactor me
	Move pv[Depth::MAX_PLY + 4];
	Score ttvalue = Score::ninf;

	bool in_check = pos.in_check();
	std::vector<Move> quiets;
	stack->in_check = in_check;
	stack->ply = (stack - 1)->ply + 1;


	U16 root_dist = stack->ply;
	const bool root_node = (type == Nodetype::root && stack->ply == 1);
	const bool pvNode = (root_node || type == Nodetype::pv);
	if (pvNode && selDepth < stack->ply + 1 && main_thread(pos))
		selDepth++;

	if (!root_node && !in_check && pos.is_draw())
			return Score::draw;

	{ // mate distance pruning
		Score mating_score = Score(Score::mate - root_dist);
		beta = std::min(mating_score, Score(beta));
		if (alpha >= mating_score)
			return mating_score;

		Score mated_score = Score(Score::mated + root_dist);
		alpha = std::max(mated_score, Score(alpha));
		if (beta <= mated_score)
			return mated_score;
	}

	// hashtable lookup
	auto hashHit = false;
	{
		hash_data e;
		hashHit = ttable.fetch(pos.key(), e);
		if (hashHit) {
			ttm = e.move;
			hashHits++;
			ttvalue = Score(e.score);
			if (!pvNode &&
				e.depth >= depth &&
				(ttvalue >= beta ? e.bound == bound_low : e.bound == bound_high)) {
				pos.stats_update(ttm, (stack - 1)->curr_move, depth, ttvalue, quiets, stack->killers);
				return ttvalue;
			}
		}
	}

	// static evaluation
	const bool anyPawnsOn7th = pos.pawns_near_promotion(); // either side has pawns on 7th
	const bool weHavePawnsOn7th = pos.pawns_on_7th(); // only side to move has pawns on 7th

	Score static_eval = (ttvalue != Score::ninf ? ttvalue :
		(stack-2)->static_eval != ninf && !in_check && (stack-2)->static_eval >= (stack-1)->static_eval ? Score((stack-2)->static_eval + 15) :
		!in_check ? 
		Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th)))) :
		Score::ninf);
	 
	//Score static_eval = Score::ninf;
	//if (ttvalue == Score::ninf &&
	//	!pvNode && 
	//	!in_check && 
	//	(stack - 2)->static_eval != Score::ninf &&
	//	(stack - 1)->best_move.type == Movetype::quiet)
	//	static_eval = Score((stack - 2)->static_eval + 33);
	//else if (!in_check)
	//	static_eval = Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th))));
	stack->static_eval = static_eval;
	bool hasStaticValue = static_eval != Score::ninf;


	// 0. Define the forward pruning conditions
	const bool forward_prune =
		(!in_check &&
		!pvNode &&
		(stack - 1)->curr_move.type == Movetype::quiet &&
		!stack->null_search &&
		abs(alpha - beta) == 1 && // only prune in null windows (same condition as !pv_node)
		hasStaticValue);

	// 1. Futility pruning
	//if (forward_prune &&
	//	!weHavePawnsOn7th &&
	//	depth <= 1 &&
	//	static_eval > mated_max_ply &&
	//	static_eval + 1150 < alpha)
	//	return Score(static_eval);

	// 2. Null move pruning
	bool null_move_allowed = (pos.to_move() == white ?
		pos.non_pawn_material<white>() :
		pos.non_pawn_material<black>());
	if (forward_prune &&
		null_move_allowed &&
		depth >= 6 &&
		static_eval - 8 * (64 - depth) >= beta) {

		int16 R = (depth >= 6 ? depth / 2 : 2);
		int16 ndepth = depth - R;

		(stack + 1)->null_search = true;
		pos.do_null_move();
		Score null_eval = Score(ndepth <= 1 ?
			-qsearch<non_pv>(pos, -beta, -beta + 1, 0, stack + 1) :
			-search<non_pv>(pos, -beta, -beta + 1, ndepth, stack + 1));
		pos.undo_null_move();
		(stack + 1)->null_search = false;


		// verification
		//null_eval = Score(ndepth <= 1 ?
		//	qsearch<non_pv>(pos, beta-1, beta, 0, stack) :
		//	search<non_pv>(pos, beta-1, beta, ndepth, stack));

		if (null_eval >= beta)
			return Score(null_eval);
		else {
			Move tm = (stack + 1)->best_move;
			if (tm.type == Movetype::capture && beta - null_eval >= 500)
				stack->threat_move = tm;
		}
	}

	// Main search
	U16 moves_searched = 0;
	haVoc::Moveorder mvs(pos, ttm, stack);
	Move move;
	Move pre_move = (stack - 1)->curr_move;
	Move pre_pre_move = (stack - 2)->curr_move;
	bool improving = stack->static_eval - (stack - 2)->static_eval >= 0;
	auto to_mv = pos.to_move();
	int SEE = 0;
	auto skipQuiets = false;
	auto rootMoves = root_node && pos.root_moves[0].pv.size() > 4;

	set_searching(pos, {}, pos.id());

	while (mvs.next_move(pos, move, pre_move, pre_pre_move, stack->threat_move, skipQuiets, rootMoves)) {

		if (UCI_SIGNALS.stop)
			return Score::draw;

		if (move.type == Movetype::no_type || !pos.is_legal(move))
			continue;


		if (main_thread(pos) && root_node && elapsed > 3000)
			std::cout << "info depth " << depth
			<< " currmove " << uci::move_to_string(move)
			<< " currmovenumber " << moves_searched << std::endl;

		// Set move data
		auto hashOrKiller = (move == ttm) ||
			(move == stack->killers[0]) ||
			(move == stack->killers[1]) ||
			(move == stack->killers[2]) ||
			(move == stack->killers[3]);
		auto isPromotion = pos.is_promotion(move.type);
		auto isCapture =
			(move.type == Movetype::capture) ||
			(move.type == Movetype::ep) ||
			pos.is_cap_promotion(Movetype(move.type));
		auto isQuiet = move.type == Movetype::quiet;
		auto isEvasion = in_check;
		auto advancedPawnPush = (pos.piece_on(Square(move.t)) == Piece::pawn) &&
			(to_mv == white ? util::row(move.t) >= Row::r6 : util::row(move.t) <= Row::r3);
		auto quietFollowingCapture = (stack - 1)->curr_move.type == Movetype::capture && isQuiet;
		auto quietFollowup = (stack - 1)->curr_move.type == Movetype::quiet && isQuiet;
		auto captureFollowup = (stack - 1)->curr_move.type == Movetype::capture && isCapture;
		auto threatResponse = (stack->threat_move.type != Movetype::no_type && stack->threat_move.f == move.t) && isCapture;
		auto dangerousQuietCheck = isQuiet && pos.quiet_gives_dangerous_check(move);

		// 4. Skip moves with negative see scores
		if (isCapture &&
			!hashOrKiller &&
			!pvNode &&
			!isEvasion &&
			!isPromotion &&
			bestScore < alpha &&
			depth <= 1 &&
			moves_searched > 1 &&
			(SEE = pos.see(move)) < 0)
			continue;

		// Debug viz readout
		//{
		//	std::unique_lock<std::mutex> lock(search_mtx);
		//	std::cout << "moveReadout " <<
		//		"depth=" << depth <<
		//		" m=" << (pos.to_move() == white ? "W" : "B") << "|" <<
		//		SanPiece[pos.piece_on(Square(move.f))] << "|" <<
		//		util::col(move.f) << "|" << util::row(move.f) << "|" <<
		//		util::col(move.t) << "|" << util::row(move.t) << std::endl;
		//}
		
		pos.do_move(move);
		stack->curr_move = move;

		bool givesCheck = pos.in_check();
		int16 extensions = givesCheck;
		int16 reductions = 1;

		// 5. Reduce uninteresting quiet moves
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			!isEvasion &&
			!givesCheck &&
			!isPromotion &&
			!advancedPawnPush &&
			depth <= 2 &&
			bestScore <= alpha)
			reductions += 1;

		// 6. Extend likely interesting quiet moves 
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			depth <= 2 &&
			bestScore < alpha &&
			bestScore > mated_max_ply &&
			(dangerousQuietCheck || advancedPawnPush || threatResponse))
			extensions += 1;

		// 7. Reduce losing captures
		//if (isCapture &&
		//	!hashOrKiller &&
		//	!givesCheck &&
		//	!isPromotion &&
		//	!isEvasion &&
		//	bestScore < alpha &&
		//	!advancedPawnPush &&
		//	depth <= 1 &&
		//	SEE < 0)
		//	reductions += 1;

		// 8. Movecount pruning from Stockfish
		skipQuiets = moves_searched >= futility_move_count(improving, depth);

		// 9. Reduction if this position is being searched by another thread
		//if (is_searching(pos, move, pos.id()))
		//	reductions += 1;

		int16 newdepth = depth + extensions - reductions;
		(stack + 1)->pv = nullptr;

		Score score = Score::ninf;
		if (moves_searched < 3) {
			(stack + 1)->pv = pv;
			(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);
			score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
				-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
		}
		else {
			int16 LMR = newdepth;
			// Late move reduction for moves unlikely to raise alpha
			if (!threatResponse &&
				!hashOrKiller &&
				!dangerousQuietCheck &&
				!captureFollowup &&
				!advancedPawnPush &&
				!isPromotion &&
				!isEvasion &&
				!givesCheck &&
				!anyPawnsOn7th &&
				depth >= 3 &&
				bestScore <= alpha) {
				unsigned R = reduction(pvNode, improving, depth, moves_searched);
				LMR -= R;
			}

			score = Score(LMR <= 1 ? -qsearch<non_pv>(pos, -alpha - 1, -alpha, 0, stack + 1) :
				-search<non_pv>(pos, -alpha - 1, -alpha, LMR - 1, stack + 1));

			if (score > alpha) {
				(stack + 1)->pv = pv;
				(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);

				score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
					-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
			}
		}
		++moves_searched;

		if (move.type == Movetype::quiet)
			quiets.emplace_back(move);


		pos.undo_move(move);

		// return if stop requested - do not updated best move or pv
		if (UCI_SIGNALS.stop)
			return Score::draw;


		// root move update
		if (root_node) {
			auto& rm = *std::find(pos.root_moves.begin(), pos.root_moves.end(), move);

			if (moves_searched == 1 || score > alpha) {
				rm.score = score;
				rm.selDepth = selDepth;
				rm.pv.resize(1);
				for (Move* m = (stack + 1)->pv;; ++m) {
					if (m->f == m->t || m->type == Movetype::no_type)
						break;
					rm.pv.push_back(*m);
				}
			}
			else rm.score = Score::ninf;
		}

		if (score > bestScore) {
			bestScore = score;
			best_move = move;
			stack->best_move = move;

			if (score >= beta) {
				// Update mate killers and quiet move stats
				pos.stats_update(best_move,
					(stack - 1)->curr_move,
					depth, bestScore, quiets, stack->killers);
				break;
			}

			if (score > alpha) {

				if (pvNode)
					alpha = score;

				if (pvNode && !root_node)
					update_pv(stack->pv, move, (stack + 1)->pv);
			}
		}


		// Penalize captures failing to raise alpha
		//if (SEE >= 0 && !pv && score < alpha && move.f != move.t && move.type == Movetype::capture) {
		//	auto capturePenalty = 2 * depth;
		//	stack->capHistory[to_mv][move.f][move.t] -= capturePenalty;
		//}

	} // end moves loop




	unset_searching(pos, {});

	// Update best move stats
	auto bestMoveBonus = 2 * depth;
	if (bestScore >= alpha && bestScore < beta && best_move.f != best_move.t) {
		stack->bestMoveHistory->bm[to_mv][best_move.f][best_move.t] += bestMoveBonus;
	}



	if (moves_searched == 0) {
		return (in_check ? Score(Score::mated + root_dist) : Score::draw);
	}

	Bound bound = (bestScore >= beta ? bound_low :
		pvNode && (best_move.type != Movetype::no_type) ? bound_exact : bound_high);
	ttable.save(pos.key(), depth, U8(bound), stack->ply, best_move, bestScore, pvNode);

	return bestScore;
}